

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O3

iterator __thiscall
fmt::v5::formatter<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_char,_void>::parse
          (formatter<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_char,_void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  byte *end;
  ulong uVar4;
  alignment aVar5;
  uint uVar6;
  byte *begin;
  byte *pbVar7;
  spec_handler handler;
  spec_handler local_38;
  width_adapter<fmt::v5::formatter<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_char,_void>::spec_handler_&,_char>
  local_28;
  
  begin = (byte *)(ctx->format_str_).data_;
  sVar1 = (ctx->format_str_).size_;
  end = begin;
  if (sVar1 != 0) {
    end = begin + sVar1;
    pbVar7 = begin + 1;
    uVar4 = (ulong)(sVar1 != 1);
    do {
      bVar3 = begin[uVar4];
      local_38.f = this;
      local_38.context = ctx;
      if (0x3d < bVar3) {
        if (bVar3 == 0x5e) {
          aVar5 = ALIGN_CENTER;
        }
        else {
          if (bVar3 != 0x3e) goto LAB_001200e4;
          aVar5 = ALIGN_RIGHT;
        }
LAB_0012010c:
        if ((int)uVar4 != 0) {
          if ((char)*begin == L'{') {
            spec_handler::on_error(&local_38,"invalid fill character \'{\'");
            break;
          }
          pbVar7 = begin + 2;
          (this->spec).fill_ = (int)(char)*begin;
        }
        (this->spec).align_ = aVar5;
        begin = pbVar7;
        break;
      }
      if (bVar3 == 0x3c) {
        aVar5 = ALIGN_LEFT;
        goto LAB_0012010c;
      }
      if (bVar3 == 0x3d) {
        aVar5 = ALIGN_NUMERIC;
        goto LAB_0012010c;
      }
LAB_001200e4:
      bVar2 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    if (begin != end) {
      bVar3 = *begin;
      if ((byte)(bVar3 - 0x30) < 10) {
        begin = begin + 1;
        uVar6 = 0;
        pbVar7 = begin;
        if (bVar3 != 0x30) {
          do {
            if (0xccccccc < uVar6) {
              begin = pbVar7 + -1;
              uVar6 = 0x80000000;
              goto LAB_001201ec;
            }
            uVar6 = ((uint)bVar3 + uVar6 * 10) - 0x30;
            begin = end;
            if (pbVar7 == end) break;
            bVar3 = *pbVar7;
            begin = pbVar7;
            pbVar7 = pbVar7 + 1;
          } while ((byte)(bVar3 - 0x30) < 10);
          if ((int)uVar6 < 0) {
LAB_001201ec:
            spec_handler::on_error(&local_38,"number is too big");
          }
        }
        ((local_38.f)->spec).width_ = uVar6;
      }
      else if (bVar3 == 0x7b) {
        pbVar7 = begin + 1;
        begin = end;
        if (((pbVar7 == end) ||
            (local_28.handler = &local_38,
            begin = (byte *)internal::
                            parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<long,std::ratio<1l,1000l>>,char,void>::spec_handler&,char>>
                                      ((char *)pbVar7,(char *)end,&local_28), begin == end)) ||
           (*begin != 0x7d)) {
          spec_handler::on_error(&local_38,"invalid format string");
        }
        else {
          begin = begin + 1;
        }
      }
      end = (byte *)internal::parse_chrono_format<char,fmt::v5::internal::chrono_format_checker>
                              ((char *)begin,(char *)end,(chrono_format_checker *)&local_28);
      (this->format_str).data_ = (char *)begin;
      (this->format_str).size_ = (long)end - (long)begin;
    }
  }
  return (iterator)end;
}

Assistant:

make_arg_ref(internal::auto_id) {
      return arg_ref_type(context.next_arg_id());
    }